

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# algorithm.hh
# Opt level: O1

void __thiscall
tchecker::algorithms::couvscc::
generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::couv_dfs
          (generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>
           *this,node_sptr_t *n,zg_t *ts,graph_t *graph,
          dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *labels,stats_t *stats)

{
  bool bVar1;
  _Elt_pointer ptVar2;
  uint *puVar3;
  bool *pbVar4;
  _Elt_pointer prVar5;
  int iVar6;
  node_sptr_t t;
  node_sptr_t local_50;
  dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_> *local_48;
  zg_t *local_40;
  graph_t *local_38;
  
  local_48 = labels;
  local_40 = ts;
  local_38 = graph;
  push(this,n,ts,graph,stats);
  do {
    ptVar2 = (this->_todo).c.
             super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (ptVar2 == (this->_todo).c.
                  super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      return;
    }
    if (ptVar2 == (this->_todo).c.
                  super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      ptVar2 = (this->_todo).c.
               super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 5;
    }
    if (ptVar2[-1].succ.
        super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        ptVar2[-1].succ.
        super__Deque_base<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>,_std::allocator<tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      prVar5 = (this->_roots).c.
               super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (prVar5 == (this->_roots).c.
                    super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first) {
        prVar5 = (this->_roots).c.
                 super__Deque_base<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::roots_stack_entry_t>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
      }
      if (prVar5[-1].n._t == ptVar2[-1].n._t) {
        close_scc(this,&ptVar2[-1].n);
      }
      std::
      deque<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t,_std::allocator<tchecker::algorithms::couvscc::generalized_algorithm_t<tchecker::zg::zg_t,_tchecker::tck_liveness::zg_couvscc::graph_t>::todo_stack_entry_t>_>
      ::pop_back(&(this->_todo).c);
LAB_00129846:
      iVar6 = 0;
    }
    else {
      todo_stack_entry_t::pick_successor((todo_stack_entry_t *)&stack0xffffffffffffffb0);
      if ((node_t *)local_50._t == (node_t *)0x0) {
LAB_00129861:
        __assert_fail("_t != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/ticktac-project[P]tchecker/src/../include/tchecker/utils/shared_objects.hh"
                      ,0x1db,
                      "T *tchecker::intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>>::operator->() const [T = tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t, tchecker::tck_liveness::zg_couvscc::edge_t>>]"
                     );
      }
      puVar3 = couvscc::node_t::dfsnum((node_t *)local_50._t);
      if (*puVar3 == 0) {
        push(this,&stack0xffffffffffffffb0,local_40,local_38,stats);
        goto LAB_00129833;
      }
      if ((node_t *)local_50._t == (node_t *)0x0) goto LAB_00129861;
      pbVar4 = couvscc::node_t::current((node_t *)local_50._t);
      if (*pbVar4 == true) {
        merge_scc(this,&stack0xffffffffffffffb0,stats,local_48);
        pbVar4 = stats_t::cycle(stats);
        if (*pbVar4 == false) goto LAB_00129833;
        iVar6 = 3;
        bVar1 = false;
      }
      else {
LAB_00129833:
        iVar6 = 0;
        bVar1 = true;
      }
      intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
      ::~intrusive_shared_ptr_t
                ((intrusive_shared_ptr_t<tchecker::make_shared_t<tchecker::graph::reachability::node_t<tchecker::tck_liveness::zg_couvscc::node_t,_tchecker::tck_liveness::zg_couvscc::edge_t>,_unsigned_long,_1UL>_>
                  *)&stack0xffffffffffffffb0);
      if (bVar1) goto LAB_00129846;
    }
    if (iVar6 != 0) {
      return;
    }
  } while( true );
}

Assistant:

void couv_dfs(node_sptr_t & n, TS & ts, GRAPH & graph, boost::dynamic_bitset<> const & labels,
                tchecker::algorithms::couvscc::stats_t & stats)
  {
    push(n, ts, graph, stats);
    while (!_todo.empty()) {
      auto && [n, succ] = _todo.top();
      if (succ.empty()) {
        if (_roots.top().n == n)
          close_scc(n);
        _todo.pop();
      }
      else {
        node_sptr_t t = _todo.top().pick_successor();
        if (t->dfsnum() == 0)
          push(t, ts, graph, stats);
        else if (t->current()) {
          merge_scc(t, stats, labels);
          if (stats.cycle())
            break;
        }
      }
    }
  }